

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

HighsHashTableEntry<int,_int> *
HighsHashTree<int,int>::findCommonInLeaf<1,4>(InnerLeaf<1> *leaf1,InnerLeaf<4> *leaf2,int hashPos)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  unsigned_long *puVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  
  uVar1 = (leaf1->occupation).occupation;
  uVar2 = (leaf2->occupation).occupation;
  uVar13 = uVar2 & uVar1;
  if (uVar13 == 0) {
    return (HighsHashTableEntry<int,_int> *)0x0;
  }
  iVar15 = -1;
  iVar14 = -1;
LAB_0028b2a2:
  do {
    if (uVar13 == 0) {
      return (HighsHashTableEntry<int,_int> *)0x0;
    }
    lVar5 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    bVar9 = (byte)lVar5;
    iVar12 = (int)POPCOUNT(uVar1 >> (bVar9 & 0x3f));
    puVar8 = (leaf1->hashes)._M_elems + (iVar15 + iVar12);
    while (uVar11 = (uint)lVar5, uVar11 != ((uint)*puVar8 >> 10 & 0x3f)) {
      iVar15 = iVar15 + 1;
      puVar8 = puVar8 + 1;
    }
    uVar13 = uVar13 ^ 1L << (bVar9 & 0x3f);
    iVar6 = (int)POPCOUNT(uVar2 >> (bVar9 & 0x3f));
    puVar8 = (leaf2->hashes)._M_elems + (iVar6 + iVar14);
    while (uVar11 != ((uint)*puVar8 >> 10 & 0x3f)) {
      iVar14 = iVar14 + 1;
      puVar8 = puVar8 + 1;
    }
    iVar12 = iVar12 + iVar15;
    uVar10 = (ulong)(uint)(iVar6 + iVar14);
    do {
      uVar3 = (leaf1->hashes)._M_elems[iVar12];
      uVar10 = (ulong)(int)uVar10;
      while (uVar4 = (leaf2->hashes)._M_elems[uVar10], uVar3 <= uVar4) {
        if (uVar4 <= uVar3) {
          if ((leaf1->entries)._M_elems[iVar12].key_ == (leaf2->entries)._M_elems[uVar10].key_) {
            return (leaf1->entries)._M_elems + iVar12;
          }
          if (((iVar12 + 1 == leaf1->size) ||
              (uVar11 != ((uint)(leaf1->hashes)._M_elems[iVar12 + 1] >> 10 & 0x3f))) ||
             ((int)uVar10 - leaf2->size == -1)) goto LAB_0028b2a2;
          uVar10 = uVar10 + 1;
          uVar7 = (uint)(leaf2->hashes)._M_elems[(int)uVar10];
          goto LAB_0028b3c1;
        }
        uVar10 = uVar10 + 1;
        if (((int)uVar10 == leaf2->size) ||
           (uVar11 != ((uint)(leaf2->hashes)._M_elems[(int)uVar10] >> 10 & 0x3f)))
        goto LAB_0028b2a2;
      }
      if (iVar12 + 1 == leaf1->size) break;
      uVar7 = (uint)(leaf1->hashes)._M_elems[iVar12 + 1];
LAB_0028b3c1:
      iVar12 = iVar12 + 1;
    } while (uVar11 == (uVar7 >> 10 & 0x3f));
  } while( true );
}

Assistant:

operator uint64_t() const { return occupation; }